

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefAsResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  mapped_type pRVar1;
  RefAs *pRVar2;
  Expression **ppEVar3;
  mapped_type *ppRVar4;
  pointer pRVar5;
  RefAs *pRVar6;
  RefAs *local_48;
  pointer local_40;
  EarlyCastFinder *local_38;
  
  pRVar5 = (this->currRefAsMove).
           super__Vector_base<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar5[index].target != (LocalGet *)0x0) {
    pRVar5 = pRVar5 + index;
    if (pRVar5->bestCast != (RefAs *)0x0) {
      pRVar2 = pRVar5->bestCast;
      local_40 = pRVar5;
      local_38 = this;
      do {
        pRVar6 = pRVar2;
        local_48 = pRVar6;
        ppEVar3 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_48,&this->options,module,AllowTeeBrIf);
        pRVar5 = local_40;
        pRVar2 = (RefAs *)*ppEVar3;
      } while ((RefAs *)*ppEVar3 != pRVar6);
      if (pRVar6 != (RefAs *)local_40->target) {
        pRVar1 = local_40->bestCast;
        ppRVar4 = std::__detail::
                  _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_38->refAsToApply,&local_40->target);
        *ppRVar4 = pRVar1;
      }
      pRVar5->bestCast = (RefAs *)0x0;
    }
    pRVar5->target = (LocalGet *)0x0;
  }
  return;
}

Assistant:

void flushRefAsResult(size_t index, Module& module) {
    auto& target = currRefAsMove[index].target;
    if (target) {
      auto& bestCast = currRefAsMove[index].bestCast;
      if (bestCast) {
        // As in flushRefCastResult, we need to check if the cast is already at
        // the target and thus does not need to be moved.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refAsToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }